

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
socketsys::SocketBindException::SocketBindException
          (SocketBindException *this,char *message,int error)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  __val = -error;
  if (0 < error) {
    __val = error;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_0010d428;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_0010d428;
      }
      if (uVar3 < 10000) goto LAB_0010d428;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_0010d428:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(error >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)error >> 0x1f) + (long)local_70[0]),__len,__val);
  strlen(message);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,(ulong)message);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_0014fc90;
  return;
}

Assistant:

explicit SocketBindException(const char* message, int error) : std::runtime_error(message + std::to_string(error)) {}